

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O2

IndexPair slang::IntervalMapDetails::distribute
                    (uint32_t numNodes,uint32_t numElements,uint32_t capacity,uint32_t *newSizes,
                    uint32_t position)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint uVar6;
  
  uVar3 = (ulong)numNodes;
  uVar2 = 0;
  uVar1 = 0;
  for (uVar4 = 0; numNodes != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = (numElements + 1) / numNodes +
            (uint)(uVar4 < (ulong)(numElements + 1) % (ulong)numNodes);
    newSizes[uVar4] = uVar5;
    uVar6 = uVar5 + uVar1;
    if ((uint32_t)uVar3 == numNodes && position < uVar6) {
      uVar2 = (ulong)(position - uVar1);
      uVar3 = uVar4 & 0xffffffff;
    }
    uVar1 = uVar6;
  }
  newSizes[uVar3] = newSizes[uVar3] - 1;
  return (IndexPair)(uVar2 << 0x20 | uVar3);
}

Assistant:

IndexPair distribute(uint32_t numNodes, uint32_t numElements, uint32_t capacity, uint32_t* newSizes,
                     uint32_t position) {
    SLANG_ASSERT(numElements + 1 <= numNodes * capacity);
    SLANG_ASSERT(position <= numElements);
    SLANG_ASSERT(numNodes > 0);

    // left-leaning even distribution
    const uint32_t perNode = (numElements + 1) / numNodes;
    const uint32_t extra = (numElements + 1) % numNodes;
    IndexPair posPair(numNodes, 0);
    uint32_t sum = 0;
    for (uint32_t n = 0; n != numNodes; ++n) {
        sum += newSizes[n] = perNode + (n < extra);
        if (posPair.first == numNodes && sum > position)
            posPair = {n, position - (sum - newSizes[n])};
    }

    // Subtract the new element that was added.
    SLANG_ASSERT(sum == numElements + 1);
    SLANG_ASSERT(posPair.first < numNodes);
    SLANG_ASSERT(newSizes[posPair.first]);
    --newSizes[posPair.first];

    return posPair;
}